

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

void __thiscall
tchecker::parsing::declaration_t::declaration_t(declaration_t *this,declaration_t *param_1)

{
  declaration_t *param_1_local;
  declaration_t *this_local;
  
  this->_vptr_declaration_t = (_func_int **)&PTR__declaration_t_003b5990;
  attributes_t::attributes_t(&this->_attr,&param_1->_attr);
  std::__cxx11::string::string((string *)&this->_context,(string *)&param_1->_context);
  return;
}

Assistant:

declaration_t::declaration_t(tchecker::parsing::declaration_t &&) = default;